

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_reprioritize_stream
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_priority_spec *pri_spec_in)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *stream_00;
  int32_t *piVar3;
  uint8_t *puVar4;
  nghttp2_priority_spec pri_spec_default;
  nghttp2_priority_spec local_3c;
  
  if (session->server == '\0') {
    if (session->pending_no_rfc7540_priorities == '\x01') goto LAB_0010a13a;
  }
  else if ((session->pending_no_rfc7540_priorities == '\x01') &&
          (session->fallback_rfc7540_priorities == '\0')) {
LAB_0010a13a:
    __assert_fail("(!session->server && session->pending_no_rfc7540_priorities != 1) || (session->server && !session_no_rfc7540_pri_no_fallback(session))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x349,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  if (pri_spec_in->stream_id == stream->stream_id) {
    __assert_fail("pri_spec->stream_id != stream->stream_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x34a,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  iVar2 = nghttp2_stream_in_dep_tree(stream);
  if (iVar2 == 0) {
    return 0;
  }
  puVar4 = &pri_spec_in->exclusive;
  piVar3 = &pri_spec_in->weight;
  if (pri_spec_in->stream_id != 0) {
    stream_00 = (nghttp2_stream *)nghttp2_map_find(&session->streams,pri_spec_in->stream_id);
    if (stream_00 == (nghttp2_stream *)0x0) {
      iVar2 = pri_spec_in->stream_id;
      if (iVar2 != 0) {
        if ((session->server == '\0') == (bool)((byte)iVar2 & 1)) {
          iVar1 = session->last_sent_stream_id;
        }
        else {
          iVar1 = session->last_recv_stream_id;
        }
        if (iVar1 < iVar2) {
          nghttp2_priority_spec_default_init(&local_3c);
          stream_00 = nghttp2_session_open_stream
                                (session,pri_spec_in->stream_id,'\0',&local_3c,NGHTTP2_STREAM_IDLE,
                                 (void *)0x0);
          if (stream_00 == (nghttp2_stream *)0x0) {
            return -0x385;
          }
          goto LAB_0010a1f9;
        }
      }
LAB_0010a1e2:
      puVar4 = &local_3c.exclusive;
      piVar3 = &local_3c.weight;
      pri_spec_in = &local_3c;
      nghttp2_priority_spec_default_init(pri_spec_in);
    }
    else {
      iVar2 = nghttp2_stream_in_dep_tree(stream_00);
      if (iVar2 == 0) goto LAB_0010a1e2;
    }
LAB_0010a1f9:
    if (pri_spec_in->stream_id != 0) {
      iVar2 = nghttp2_stream_dep_find_ancestor(stream_00,stream);
      if (iVar2 != 0) {
        nghttp2_stream_dep_remove_subtree(stream_00);
        iVar2 = nghttp2_stream_dep_add_subtree(stream->dep_prev,stream_00);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      if (stream_00 == (nghttp2_stream *)0x0) {
        __assert_fail("dep_stream",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0x371,
                      "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                     );
      }
      goto LAB_0010a252;
    }
  }
  stream_00 = &session->root;
LAB_0010a252:
  if ((stream_00 == stream->dep_prev) && (*puVar4 == '\0')) {
    nghttp2_stream_change_weight(stream,*piVar3);
    iVar2 = 0;
  }
  else {
    nghttp2_stream_dep_remove_subtree(stream);
    stream->weight = *piVar3;
    if (*puVar4 == '\0') {
      iVar2 = nghttp2_stream_dep_add_subtree(stream_00,stream);
    }
    else {
      iVar2 = nghttp2_stream_dep_insert_subtree(stream_00,stream);
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_reprioritize_stream(
  nghttp2_session *session, nghttp2_stream *stream,
  const nghttp2_priority_spec *pri_spec_in) {
  int rv;
  nghttp2_stream *dep_stream = NULL;
  nghttp2_priority_spec pri_spec_default;
  const nghttp2_priority_spec *pri_spec = pri_spec_in;

  assert((!session->server && session->pending_no_rfc7540_priorities != 1) ||
         (session->server && !session_no_rfc7540_pri_no_fallback(session)));
  assert(pri_spec->stream_id != stream->stream_id);

  if (!nghttp2_stream_in_dep_tree(stream)) {
    return 0;
  }

  if (pri_spec->stream_id != 0) {
    dep_stream = nghttp2_session_get_stream_raw(session, pri_spec->stream_id);

    if (!dep_stream &&
        session_detect_idle_stream(session, pri_spec->stream_id)) {
      nghttp2_priority_spec_default_init(&pri_spec_default);

      dep_stream = nghttp2_session_open_stream(
        session, pri_spec->stream_id, NGHTTP2_FLAG_NONE, &pri_spec_default,
        NGHTTP2_STREAM_IDLE, NULL);

      if (dep_stream == NULL) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else if (!dep_stream || !nghttp2_stream_in_dep_tree(dep_stream)) {
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }
  }

  if (pri_spec->stream_id == 0) {
    dep_stream = &session->root;
  } else if (nghttp2_stream_dep_find_ancestor(dep_stream, stream)) {
    DEBUGF("stream: cycle detected, dep_stream(%p)=%d stream(%p)=%d\n",
           dep_stream, dep_stream->stream_id, stream, stream->stream_id);

    nghttp2_stream_dep_remove_subtree(dep_stream);
    rv = nghttp2_stream_dep_add_subtree(stream->dep_prev, dep_stream);
    if (rv != 0) {
      return rv;
    }
  }

  assert(dep_stream);

  if (dep_stream == stream->dep_prev && !pri_spec->exclusive) {
    /* This is minor optimization when just weight is changed. */
    nghttp2_stream_change_weight(stream, pri_spec->weight);

    return 0;
  }

  nghttp2_stream_dep_remove_subtree(stream);

  /* We have to update weight after removing stream from tree */
  stream->weight = pri_spec->weight;

  if (pri_spec->exclusive) {
    rv = nghttp2_stream_dep_insert_subtree(dep_stream, stream);
  } else {
    rv = nghttp2_stream_dep_add_subtree(dep_stream, stream);
  }

  if (rv != 0) {
    return rv;
  }

  return 0;
}